

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::GetTargetDirectDepends
          (cmComputeTargetDepends *this,cmGeneratorTarget *t,cmTargetDependSet *deps)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  _Rb_tree_iterator<cmTargetDepend> _Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  pointer pcVar7;
  pair<std::_Rb_tree_iterator<cmTargetDepend>,_bool> pVar8;
  cmTargetDepend local_50;
  
  p_Var1 = &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->TargetIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(cmGeneratorTarget **)(p_Var6 + 1) < t]) {
    if (*(cmGeneratorTarget **)(p_Var6 + 1) >= t) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var6 = p_Var5, t < *(cmGeneratorTarget **)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    pcVar2 = (this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar7 = *(pointer *)
              &pcVar2[*(int *)&p_Var6[1]._M_parent].
               super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
               super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    pcVar3 = *(pointer *)
              ((long)&pcVar2[*(int *)&p_Var6[1]._M_parent].
                      super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    if (pcVar7 != pcVar3) {
      do {
        local_50.Target =
             (this->Targets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start[pcVar7->Dest];
        local_50.Link = false;
        local_50.Util = false;
        local_50.Cross = false;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  (&local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
        pVar8 = std::
                _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                ::_M_insert_unique<cmTargetDepend>
                          ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                            *)deps,&local_50);
        _Var4 = pVar8.first._M_node;
        if (local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (pcVar7->Strong == true) {
          *(undefined1 *)((long)&_Var4._M_node[1]._M_parent + 1) = 1;
        }
        else {
          *(undefined1 *)&_Var4._M_node[1]._M_parent = 1;
        }
        *(bool *)((long)&_Var4._M_node[1]._M_parent + 2) = pcVar7->Cross;
        _Var4._M_node[1]._M_left =
             *(_Base_ptr *)
              &(pcVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Var4._M_node[1]._M_right,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pcVar7->Backtrace).
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8));
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != pcVar3);
    }
    return;
  }
  __assert_fail("tii != this->TargetIndex.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmComputeTargetDepends.cxx"
                ,0xa1,
                "void cmComputeTargetDepends::GetTargetDirectDepends(const cmGeneratorTarget *, cmTargetDependSet &)"
               );
}

Assistant:

void cmComputeTargetDepends::GetTargetDirectDepends(cmGeneratorTarget const* t,
                                                    cmTargetDependSet& deps)
{
  // Lookup the index for this target.  All targets should be known by
  // this point.
  auto tii = this->TargetIndex.find(t);
  assert(tii != this->TargetIndex.end());
  int i = tii->second;

  // Get its final dependencies.
  EdgeList const& nl = this->FinalGraph[i];
  for (cmGraphEdge const& ni : nl) {
    cmGeneratorTarget const* dep = this->Targets[ni];
    auto di = deps.insert(dep).first;
    di->SetType(ni.IsStrong());
    di->SetCross(ni.IsCross());
    di->SetBacktrace(ni.GetBacktrace());
  }
}